

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O1

double __thiscall Noise::generateRandomGaussian(Noise *this,double mean,double StandardDerivation)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = generateRandomGaussian::v2;
  if (generateRandomGaussian::phase == 0) {
    do {
      do {
        iVar1 = rand();
        generateRandomGaussian::v1 = ((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0;
        iVar1 = rand();
        generateRandomGaussian::v2 = ((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0;
        generateRandomGaussian::s =
             generateRandomGaussian::v1 * generateRandomGaussian::v1 +
             generateRandomGaussian::v2 * generateRandomGaussian::v2;
      } while (1.0 <= generateRandomGaussian::s);
      dVar3 = generateRandomGaussian::v1;
    } while ((generateRandomGaussian::s == 0.0) && (!NAN(generateRandomGaussian::s)));
  }
  dVar2 = log(generateRandomGaussian::s);
  dVar2 = (dVar2 * -2.0) / generateRandomGaussian::s;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  generateRandomGaussian::phase = 1 - generateRandomGaussian::phase;
  return dVar3 * dVar2 * StandardDerivation + mean;
}

Assistant:

double Noise::generateRandomGaussian(double mean, double StandardDerivation)
{
    static double v1, v2, s;
    static int phase = 0;
    double x;

    if(phase == 0)
    {
        do
        {
            v1 = -1 + 2 * (double)rand() / (double) RAND_MAX;
            v2 = -1 + 2 * (double)rand() / (double) RAND_MAX;
            s = v1 * v1 + v2 * v2;
        }while (s >= 1 || s == 0);

        x = v1 * sqrt(-2 * log(s) / s);
    }
    else
        x = v2 * sqrt(-2 * log(s) / s);

    phase = 1 - phase;

    return x * StandardDerivation + mean;
}